

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

void __thiscall Parse::SMTLIB2::readDeclareSort(SMTLIB2 *this,string *name,string *arity)

{
  pair<unsigned_int,_Parse::SMTLIB2::SymbolType> val_00;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined1 uVar4;
  SymbolType SVar5;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined8 uVar6;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  pair<unsigned_int,_Parse::SMTLIB2::SymbolType> key;
  Symbol *this_01;
  OperatorType *type;
  string *in_RDX;
  long in_RDI;
  undefined1 auVar7 [12];
  uint srt;
  bool added;
  uint val;
  string pName;
  string *in_stack_fffffffffffffd08;
  uint n;
  Signature *in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  uint in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  undefined6 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd74;
  undefined1 outerParentheses;
  Expression *in_stack_fffffffffffffd78;
  string local_280 [32];
  SymbolType local_260;
  undefined1 local_259;
  bool *in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffdec;
  string *in_stack_fffffffffffffdf0;
  Signature *in_stack_fffffffffffffdf8;
  string local_110 [39];
  undefined1 local_e9;
  undefined4 local_44;
  undefined8 local_40;
  string local_38 [32];
  string *local_18;
  
  outerParentheses = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18);
  local_18 = in_RDX;
  std::operator+(in_stack_fffffffffffffd38,
                 (char *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  bVar1 = isAlreadyKnownSymbol
                    ((SMTLIB2 *)
                     CONCAT17(in_stack_fffffffffffffd1f,
                              CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                     (string *)in_stack_fffffffffffffd10);
  if (bVar1) {
    local_e9 = 1;
    __lhs = (char *)__cxa_allocate_exception(0x50);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffd57,
                                  CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Shell::LispParser::Expression::toString_abi_cxx11_
              (in_stack_fffffffffffffd78,(bool)outerParentheses);
    std::operator+(in_stack_fffffffffffffd48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Lib::UserErrorException::Exception
              ((UserErrorException *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_e9 = 0;
    __cxa_throw(__lhs,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  std::__cxx11::string::string(local_110,local_18);
  uVar2 = Lib::StringUtils::isPositiveInteger
                    ((string *)
                     CONCAT17(in_stack_fffffffffffffd1f,
                              CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)));
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string(local_110);
  if ((bVar3 & 1) != 0) {
    __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x50);
    std::operator+(in_stack_fffffffffffffd58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffd50)));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Shell::LispParser::Expression::toString_abi_cxx11_
              (in_stack_fffffffffffffd78,(bool)outerParentheses);
    std::operator+(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Lib::UserErrorException::Exception
              ((UserErrorException *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    __cxa_throw(__lhs_00,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  uVar4 = Lib::Int::stringToUnsignedInt
                    ((string *)in_stack_fffffffffffffd10,(uint *)in_stack_fffffffffffffd08);
  if (!(bool)uVar4) {
    local_259 = 1;
    uVar6 = __cxa_allocate_exception(0x50);
    std::operator+(in_stack_fffffffffffffd58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffd50)));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Shell::LispParser::Expression::toString_abi_cxx11_
              (in_stack_fffffffffffffd78,(bool)outerParentheses);
    std::operator+(in_stack_fffffffffffffd48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,in_stack_fffffffffffffd40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,
                            CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
                   (char *)in_stack_fffffffffffffd10);
    Lib::UserErrorException::Exception
              ((UserErrorException *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_259 = 0;
    __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  SVar5 = Kernel::Signature::addTypeCon
                    (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                     in_stack_fffffffffffffde0);
  this_00 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
             *)(in_RDI + 0x78);
  local_260 = SVar5;
  std::__cxx11::string::string(local_280,local_38);
  key = std::make_pair<unsigned_int&,Parse::SMTLIB2::SymbolType>
                  ((uint *)in_stack_fffffffffffffd08,(SymbolType *)0xa4c220);
  n = (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  val_00.second = SVar5;
  val_00.first = in_stack_fffffffffffffd30;
  bVar1 = Lib::
          DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::insert(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key,
                   val_00);
  SVar5 = key.second;
  bVar3 = bVar1 ^ 0xff;
  auVar7 = std::__cxx11::string::~string(local_280);
  local_44 = auVar7._8_4_;
  local_40 = CONCAT71(auVar7._1_7_,bVar3);
  if ((bVar3 & 1) == 0) {
    this_01 = Kernel::Signature::getTypeCon(in_stack_fffffffffffffd10,n);
    type = Kernel::OperatorType::getTypeConType(SVar5);
    Kernel::Signature::Symbol::setType(this_01,type);
    std::__cxx11::string::~string(local_38);
    return;
  }
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_38);
  _Unwind_Resume(local_40);
}

Assistant:

void SMTLIB2::readDeclareSort(const std::string& name, const std::string& arity)
{
  std::string pName = name + TYPECON_POSTFIX;
  if (isAlreadyKnownSymbol(pName)) {
    USER_ERROR_EXPR("Redeclaring built-in, declared or defined sort symbol: "+name);
  }

  if (not StringUtils::isPositiveInteger(arity)) {
    USER_ERROR_EXPR("Unrecognized declared sort arity: "+arity);
  }

  unsigned val;
  if (!Int::stringToUnsignedInt(arity, val)) {
    USER_ERROR_EXPR("Couldn't convert sort arity: "+arity);
  }

  bool added;
  unsigned srt = env.signature->addTypeCon(pName,val,added);
  ASS(added);
  ALWAYS(_declaredSymbols.insert(pName,make_pair(srt,SymbolType::TYPECON)));
  env.signature->getTypeCon(srt)->setType(OperatorType::getTypeConType(val));
}